

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O0

int32_t MsgHelper::serializeAddr(S5AddrInfo *info,uint8_t *buf)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int32_t ADDR_LEN;
  uint8_t *buf_local;
  S5AddrInfo *info_local;
  
  *buf = info->ATYP;
  if (info->ATYP == '\x01') {
    local_24 = 4;
    iVar1 = inet_pton(2,info->ADDR,buf + 1);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else if (info->ATYP == '\x04') {
    local_24 = 0x10;
    iVar1 = inet_pton(10,info->ADDR,buf + 1);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    sVar2 = strlen(info->ADDR);
    buf[1] = (uint8_t)sVar2;
    memcpy(buf + 2,info->ADDR,(ulong)buf[1]);
    local_24 = buf[1] + 1;
  }
  writeUint16InBigEndian(buf + (local_24 + 1),info->PORT);
  return local_24 + 3;
}

Assistant:

int32_t MsgHelper::serializeAddr(const S5AddrInfo* info, uint8_t* buf)
{
	int32_t ADDR_LEN;
	buf[0] = info->ATYP;
	if(info->ATYP == SOKS5_ATYP_IPV4)
	{
		ADDR_LEN = 4;
		if(0 == ::inet_pton(AF_INET, info->ADDR, &buf[1]))
			return 0;
	}
	else if(info->ATYP == SOKS5_ATYP_IPV6)
	{
		ADDR_LEN = 16;
		if(0 == ::inet_pton(AF_INET6, info->ADDR, &buf[1]))
			return 0;
	}
	else
	{
		buf[1] = (uint8_t)strlen(info->ADDR);
		memcpy(buf + 2, info->ADDR, buf[1]);
		ADDR_LEN = buf[1] + 1;
	}
	writeUint16InBigEndian((void*)&buf[1 + ADDR_LEN], info->PORT);
	return 1 + ADDR_LEN + 2;
}